

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O3

bool __thiscall xray_re::xr_level::load(xr_level *this,char *game_data_path,char *level_path)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  xr_reader *this_00;
  size_t sVar4;
  bool bVar5;
  
  if ((xr_file_system::instance()::instance0 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&xr_file_system::instance()::instance0), iVar3 != 0)) {
    xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
    __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,&__dso_handle)
    ;
    __cxa_guard_release(&xr_file_system::instance()::instance0);
  }
  this_00 = xr_file_system::r_open(&xr_file_system::instance::instance0,level_path,"level");
  if (this_00 == (xr_reader *)0x0) {
    return false;
  }
  sVar4 = xr_reader::find_chunk(this_00,1);
  if (sVar4 == 0) {
    bVar5 = false;
  }
  else {
    puVar2 = (this_00->field_2).m_p_u16;
    (this_00->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar1 = *puVar2;
    (this_00->field_2).m_p = (uint8_t *)(puVar2 + 2);
    this->m_xrlc_quality = (uint)puVar2[1];
    if (5 < uVar1 - 9) {
      if ((uVar1 != 8) && (uVar1 != 5)) {
        bVar5 = false;
        msg("unknown xrLC version %u");
        goto LAB_00164f3e;
      }
      (this_00->field_2).m_p = (this_00->field_2).m_p + 0x7c;
    }
    load(this,(uint)uVar1,game_data_path,level_path,this_00);
    bVar5 = true;
  }
LAB_00164f3e:
  (*this_00->_vptr_xr_reader[1])(this_00);
  return bVar5;
}

Assistant:

bool xr_level::load(const char* game_data_path, const char* level_path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(level_path, "level");
	if (r == 0)
		return false;
	bool status = false;
	if (r->find_chunk(FSL_HEADER)) {
		uint32_t xrlc_version = r->r_u16();
		m_xrlc_quality = r->r_u16();
		switch (xrlc_version) {
		case XRLC_VERSION_5:
		case XRLC_VERSION_8:
			{
				char buf[124];
				r->r_cseq(sizeof(buf), buf);
			}
			// fall through
		case XRLC_VERSION_9:
		case XRLC_VERSION_10:
		case XRLC_VERSION_11:
		case XRLC_VERSION_12:
		case XRLC_VERSION_13:
		case XRLC_VERSION_14:
			r->debug_find_chunk();
			load(xrlc_version, game_data_path, level_path, *r);
			status = true;
			break;
		default:
			msg("unknown xrLC version %" PRIu32, xrlc_version);
			break;
		}
	}
	fs.r_close(r);
	return status;
}